

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O1

XMLCh * __thiscall xercesc_4_0::QName::getRawName(QName *this)

{
  short *psVar1;
  XMLCh *pXVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  XMLCh **ppXVar7;
  long lVar8;
  
  ppXVar7 = &this->fRawName;
  pXVar2 = this->fRawName;
  if ((pXVar2 == (XMLCh *)0x0) || (*pXVar2 == L'\0')) {
    if (*this->fPrefix == L'\0') {
      ppXVar7 = &this->fLocalPart;
    }
    else {
      XVar3 = this->fPrefixBufSz;
      XVar4 = this->fLocalPartBufSz;
      uVar6 = XVar4 + XVar3 + 1;
      if ((pXVar2 == (XMLCh *)0x0) || (this->fRawNameBufSz < uVar6)) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])();
        this->fRawName = (XMLCh *)0x0;
        this->fRawNameBufSz = uVar6;
        iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                          (this->fMemoryManager,(XVar4 + XVar3) * 2 + 4);
        this->fRawName = (XMLCh *)CONCAT44(extraout_var,iVar5);
        *(XMLCh *)CONCAT44(extraout_var,iVar5) = L'\0';
      }
      pXVar2 = this->fPrefix;
      lVar8 = 0;
      if (pXVar2 != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)pXVar2 + lVar8);
          lVar8 = lVar8 + 2;
        } while (*psVar1 != 0);
        lVar8 = (lVar8 >> 1) + -1;
      }
      memmove(this->fRawName,pXVar2,lVar8 * 2);
      pXVar2 = this->fRawName;
      pXVar2[lVar8] = L':';
      XMLString::copyString(pXVar2 + lVar8 + 1,this->fLocalPart);
    }
  }
  return *ppXVar7;
}

Assistant:

XMLCh* QName::getRawName()
{
    //
    //  If there is no buffer, or if there is but we've not faulted in the
    //  value yet, then we have to do that now.
    //
    if (!fRawName || !*fRawName)
    {
        //
        //  If we have a prefix, then do the prefix:name version. Else, its
        //  just the name.
        //
        if (*fPrefix)
        {
            //
            //  Calculate the worst case size buffer we will need. We use the
            //  current high water marks of the prefix and name buffers, so it
            //  might be a little wasteful of memory but we don't have to do
            //  string len operations on the two strings.
            //
            const XMLSize_t neededLen = fPrefixBufSz + fLocalPartBufSz + 1;

            //
            //  If no buffer, or the current one is too small, then allocate one
            //  and get rid of any old one.
            //
            if (!fRawName || (neededLen > fRawNameBufSz))
            {
                fMemoryManager->deallocate(fRawName); //delete [] fRawName;
                
                fRawName = 0;
                // We have to cast off the const'ness to do this
                (const_cast<QName*>(this))->fRawNameBufSz = neededLen;
                (const_cast<QName*>(this))->fRawName = (XMLCh*) fMemoryManager->allocate
                (
                    (neededLen + 1) * sizeof(XMLCh)
                ); //new XMLCh[neededLen + 1];

                // Make sure its initially empty
                *fRawName = 0;
            }


            const XMLSize_t prefixLen = XMLString::stringLen(fPrefix);

            XMLString::moveChars(fRawName, fPrefix, prefixLen);
            fRawName[prefixLen] = chColon;
            XMLString::copyString(&fRawName[prefixLen+1], fLocalPart);
        }
         else
        {
            return fLocalPart;
        }
    }
    return fRawName;
}